

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFlightData.cpp
# Opt level: O2

void LTFlightData::AppendAllNewPos(void)

{
  atomic_flag aVar1;
  _Base_ptr p_Var2;
  unique_lock<std::mutex> lock;
  unique_lock<std::recursive_mutex> lockFD;
  
  aVar1.super___atomic_flag_base._M_i = flagNoNewPosToAdd.super___atomic_flag_base._M_i;
  LOCK();
  flagNoNewPosToAdd.super___atomic_flag_base._M_i = (__atomic_flag_base)true;
  UNLOCK();
  if (aVar1.super___atomic_flag_base._M_i == false) {
    lock._M_device = &mapFdMutex;
    lock._M_owns = std::mutex::try_lock(&mapFdMutex);
    if (lock._M_owns) {
      for (p_Var2 = mapFd._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var2 != &mapFd._M_t._M_impl.super__Rb_tree_header;
          p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
        lockFD._M_device = (mutex_type *)&p_Var2[0x1e]._M_parent;
        lockFD._M_owns = std::recursive_mutex::try_lock(lockFD._M_device);
        if (lockFD._M_owns) {
          if ((char)p_Var2[0x1e]._M_color == _S_black) {
            AppendNewPos((LTFlightData *)&p_Var2[2]._M_left);
          }
        }
        else {
          LOCK();
          flagNoNewPosToAdd.super___atomic_flag_base._M_i = (__atomic_flag_base)false;
          UNLOCK();
        }
        std::unique_lock<std::recursive_mutex>::~unique_lock(&lockFD);
      }
    }
    else {
      LOCK();
      flagNoNewPosToAdd.super___atomic_flag_base._M_i = (__atomic_flag_base)false;
      UNLOCK();
    }
    std::unique_lock<std::mutex>::~unique_lock(&lock);
  }
  return;
}

Assistant:

void LTFlightData::AppendAllNewPos()
{
    // short-cut if nothing to do
    if (flagNoNewPosToAdd.test_and_set())
        return;

    // somewhere there is something to do
    // need access to flight data map
    try {
        std::unique_lock<std::mutex> lock (mapFdMutex, std::try_to_lock);
        if (!lock) {
            // couldn't get the lock right away
            // -> return, we don't want to hinder rendering
            flagNoNewPosToAdd.clear();      // but need to try again
            return;
        }
        
        // loop all flight data objects and check for new data to analyse
        for (mapLTFlightDataTy::value_type& fdPair: mapFd) {
            LTFlightData& fd = fdPair.second;
            try {
                std::unique_lock<std::recursive_mutex> lockFD (fd.dataAccessMutex, std::try_to_lock);
                if (!lockFD) {
                    flagNoNewPosToAdd.clear();          // need to try it again
                } else {
                    if (fd.IsValid())
                        fd.AppendNewPos();
                }
            } catch (const std::exception& e) {
                LOG_MSG(logERR, ERR_TOP_LEVEL_EXCEPTION, e.what());
                fd.SetInvalid();
            } catch (...) {
                fd.SetInvalid();
            }
        }
    } catch(const std::system_error& e) {
        LOG_MSG(logERR, ERR_LOCK_ERROR, "mapFdMutex", e.what());
        flagNoNewPosToAdd.clear();
    }
}